

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

size_t aheads_masks_nbytes(whisper_aheads_masks *aheads_masks)

{
  size_type sVar1;
  reference ppgVar2;
  long lVar3;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_RDI;
  size_t i;
  size_t size;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::size(in_RDI);
    if (sVar1 <= local_18) break;
    ppgVar2 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                        (in_RDI,local_18);
    if (*ppgVar2 != (value_type)0x0) {
      ppgVar2 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                          (in_RDI,local_18);
      lVar3 = ggml_nbytes(*ppgVar2);
      local_10 = lVar3 + local_10;
    }
    local_18 = local_18 + 1;
  }
  return local_10;
}

Assistant:

static size_t aheads_masks_nbytes(struct whisper_aheads_masks & aheads_masks) {
    size_t size = 0;
    for (size_t i = 0; i < aheads_masks.m.size(); ++i) {
        if (aheads_masks.m[i] != nullptr)
            size += ggml_nbytes(aheads_masks.m[i]);
    }
    return size;
}